

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O0

ByteData *
cfd::core::WallyUtil::ConvertMnemonicToSeed
          (ByteData *__return_storage_ptr__,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *mnemonic,string *passphrase,bool use_ideographic_space)

{
  CfdError error_code;
  char *mnemonic_00;
  string *message;
  uchar *bytes_out;
  undefined8 uVar1;
  allocator_type *in_stack_fffffffffffffee0;
  uint in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  CfdException *this;
  allocator local_e9;
  string local_e8 [32];
  CfdSourceLocation local_c8;
  CfdError local_ac;
  size_t sStack_a8;
  int ret;
  size_t out_size;
  undefined1 local_98 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> seed_bytes;
  string mnemonic_sentence;
  allocator local_49;
  string local_48 [8];
  string delimitor;
  bool use_ideographic_space_local;
  string *passphrase_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *mnemonic_local;
  ByteData *seed;
  
  delimitor.field_2._M_local_buf[0xf] = use_ideographic_space;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_48," ",&local_49);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if ((delimitor.field_2._M_local_buf[0xf] & 1U) != 0) {
    ::std::__cxx11::string::operator=(local_48,"0");
  }
  StringUtil::Join((StringUtil *)
                   &seed_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)mnemonic,(string *)local_48);
  this = (CfdException *)((long)&out_size + 7);
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x3fa27c);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),in_stack_fffffffffffffee0
            );
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x3fa2a2);
  sStack_a8 = 0;
  mnemonic_00 = (char *)::std::__cxx11::string::c_str();
  message = (string *)::std::__cxx11::string::c_str();
  bytes_out = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3fa2d9);
  error_code = bip39_mnemonic_to_seed
                         (mnemonic_00,(char *)message,bytes_out,0x40,&stack0xffffffffffffff58);
  local_ac = error_code;
  if (error_code == kCfdSuccess) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
               (ulong)in_stack_fffffffffffffee8);
    ByteData::ByteData(__return_storage_ptr__,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
    ::std::__cxx11::string::~string
              ((string *)
               &seed_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    ::std::__cxx11::string::~string(local_48);
    return __return_storage_ptr__;
  }
  local_c8.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_wally_util.cpp"
               ,0x2f);
  local_c8.filename = local_c8.filename + 1;
  local_c8.line = 0xda;
  local_c8.funcname = "ConvertMnemonicToSeed";
  logger::warn<int&>(&local_c8,"Convert mnemonic to seed error. ret=[{}]",&local_ac);
  uVar1 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_e8,"Convert mnemonic to seed error.",&local_e9);
  CfdException::CfdException(this,error_code,message);
  __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData WallyUtil::ConvertMnemonicToSeed(
    const std::vector<std::string>& mnemonic, const std::string& passphrase,
    bool use_ideographic_space) {
  std::string delimitor = kMnemonicDelimiter;
  if (use_ideographic_space) {
    delimitor = kMnemonicIdeographicDelimiter;
  }
  std::string mnemonic_sentence = StringUtil::Join(mnemonic, delimitor);
  std::vector<uint8_t> seed_bytes(kByteData512Length);
  size_t out_size = 0;
  int ret = bip39_mnemonic_to_seed(
      mnemonic_sentence.c_str(), passphrase.c_str(), seed_bytes.data(),
      kSeedBytesLen, &out_size);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "Convert mnemonic to seed error. ret=[{}]", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Convert mnemonic to seed error.");
  }

  seed_bytes.resize(out_size);
  ByteData seed(seed_bytes);

  return seed;
}